

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O2

CURLcode Curl_headers_push(Curl_easy *data,char *header,uchar type)

{
  Curl_llist *list;
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  Curl_header_store *ne;
  Curl_header_store *pCVar4;
  char *pcVar5;
  long lVar6;
  char cVar7;
  long lVar8;
  ulong __n;
  char *pcVar9;
  
  cVar7 = *header;
  if (cVar7 == '\n') {
    return CURLE_OK;
  }
  if (cVar7 == '\r') {
    return CURLE_OK;
  }
  pcVar2 = strchr(header,0xd);
  if ((pcVar2 == (char *)0x0) && (pcVar2 = strchr(header,10), pcVar2 == (char *)0x0)) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  lVar8 = (long)pcVar2 - (long)header;
  if ((cVar7 == ' ') || (cVar7 == '\t')) {
    pCVar4 = (data->state).prevhead;
    if (pCVar4 == (Curl_header_store *)0x0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    pcVar2 = pCVar4->value;
    sVar3 = strlen(pcVar2);
    for (; (lVar8 != -1 &&
           (((cVar1 = header[lVar8], cVar1 == '\t' || (cVar1 == ' ')) || ((byte)(cVar1 - 10U) < 4)))
           ); lVar8 = lVar8 + -1) {
    }
    lVar6 = (long)pCVar4 + (-lVar8 - (long)pcVar2) + -6;
    __n = lVar8 + 1;
    for (pcVar9 = header + 1;
        ((1 < __n && ((cVar7 == ' ' || (cVar7 == '\t')))) &&
        ((cVar7 = *pcVar9, cVar7 == ' ' || (cVar7 == '\t')))); pcVar9 = pcVar9 + 1) {
      __n = __n - 1;
      lVar6 = lVar6 + 1;
    }
    list = &(data->state).httphdrs;
    Curl_llist_remove(list,&pCVar4->node,(void *)0x0);
    ne = (Curl_header_store *)Curl_saferealloc(pCVar4,sVar3 - lVar6);
    if (ne == (Curl_header_store *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    ne->name = ne->buffer;
    pcVar2 = (char *)(((long)pcVar2 - (long)pCVar4) + (long)ne);
    ne->value = pcVar2;
    memcpy(pcVar2 + sVar3,pcVar9 + -1,__n);
    ne->value[__n + sVar3] = '\0';
    Curl_llist_insert_next(list,(data->state).httphdrs.tail,ne,(Curl_llist_element *)ne);
    (data->state).prevhead = ne;
    return CURLE_OK;
  }
  pCVar4 = (Curl_header_store *)(*Curl_ccalloc)(1,lVar8 + 0x31);
  if (pCVar4 == (Curl_header_store *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar2 = pCVar4->buffer;
  memcpy(pcVar2,header,lVar8 + 1);
  *(undefined1 *)((long)pCVar4 + lVar8 + 0x2e) = 0;
  pcVar9 = pcVar2;
  if (type == '\x10') {
    if (*pcVar2 != ':') goto LAB_00432d45;
    pcVar9 = &pCVar4->field_0x2e;
  }
  while( true ) {
    pcVar5 = pcVar9;
    pcVar9 = pcVar5 + 1;
    if (*pcVar5 == '\0') break;
    if (*pcVar5 == ':') {
      *pcVar5 = '\0';
      for (; (*pcVar9 == '\t' || (*pcVar9 == ' ')); pcVar9 = pcVar9 + 1) {
      }
      for (pcVar5 = (char *)((long)pCVar4 + lVar8 + 0x2d);
          (pcVar9 < pcVar5 &&
          (((cVar7 = *pcVar5, cVar7 == '\t' || (cVar7 == ' ')) || ((byte)(cVar7 - 10U) < 4))));
          pcVar5 = pcVar5 + -1) {
        *pcVar5 = '\0';
      }
      pCVar4->name = pcVar2;
      pCVar4->value = pcVar9;
      pCVar4->type = type;
      pCVar4->request = (data->state).requests;
      Curl_llist_insert_next
                (&(data->state).httphdrs,(data->state).httphdrs.tail,pCVar4,
                 (Curl_llist_element *)pCVar4);
      (data->state).prevhead = pCVar4;
      return CURLE_OK;
    }
  }
LAB_00432d45:
  (*Curl_cfree)(pCVar4);
  return CURLE_BAD_FUNCTION_ARGUMENT;
}

Assistant:

CURLcode Curl_headers_push(struct Curl_easy *data, const char *header,
                           unsigned char type)
{
  char *value = NULL;
  char *name = NULL;
  char *end;
  size_t hlen; /* length of the incoming header */
  struct Curl_header_store *hs;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  if((header[0] == '\r') || (header[0] == '\n'))
    /* ignore the body separator */
    return CURLE_OK;

  end = strchr(header, '\r');
  if(!end) {
    end = strchr(header, '\n');
    if(!end)
      return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  hlen = end - header + 1;

  if((header[0] == ' ') || (header[0] == '\t')) {
    if(data->state.prevhead)
      /* line folding, append value to the previous header's value */
      return unfold_value(data, header, hlen);
    else
      /* can't unfold without a previous header */
      return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  hs = calloc(1, sizeof(*hs) + hlen);
  if(!hs)
    return CURLE_OUT_OF_MEMORY;
  memcpy(hs->buffer, header, hlen);
  hs->buffer[hlen] = 0; /* nul terminate */

  result = namevalue(hs->buffer, hlen, type, &name, &value);
  if(result)
    goto fail;

  hs->name = name;
  hs->value = value;
  hs->type = type;
  hs->request = data->state.requests;

  /* insert this node into the list of headers */
  Curl_llist_insert_next(&data->state.httphdrs, data->state.httphdrs.tail,
                         hs, &hs->node);
  data->state.prevhead = hs;
  return CURLE_OK;
  fail:
  free(hs);
  return result;
}